

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldExtractInt::test
          (ShaderBitfieldOperationCaseBitfieldExtractInt *this,Data *data)

{
  uint uVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = this->m_components;
  uVar5 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar3;
    if (uVar5 == uVar4) break;
    cVar2 = (char)data->bits;
    uVar3 = uVar4 + 1;
  } while (data->outIvec4[uVar4] ==
           (data->inIvec4[uVar4] << (-((char)data->offset + cVar2) & 0x1fU)) >> (-cVar2 & 0x1fU));
  return (long)(int)uVar1 <= (long)uVar4;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected = data->inIvec4[i] << (32 - (data->offset + data->bits));
			expected >>= 32 - data->bits;
			if (data->outIvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}